

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O1

bool anon_unknown.dwarf_1f65f7::checkPixels<unsigned_int>
               (Array2D<unsigned_int> *sampleCount,Array2D<unsigned_int_*> *ph,int lx,int rx,int ly,
               int ry,int width)

{
  long lVar1;
  uint uVar2;
  bool bVar3;
  long lVar4;
  ostream *poVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  bool bVar11;
  bool local_73;
  
  local_73 = ry < ly;
  if (ly <= ry) {
    lVar8 = (long)ly;
    do {
      if (lx <= rx) {
        lVar7 = (long)lx;
        bVar3 = rx < lx;
        do {
          uVar2 = sampleCount->_data[sampleCount->_sizeY * lVar8 + lVar7];
          bVar11 = uVar2 != 0;
          if (bVar11) {
            uVar10 = ((int)lVar8 * width + (int)lVar7) % 0x801;
            if (*ph->_data[ph->_sizeY * lVar8 + lVar7] == uVar10) {
              lVar9 = 0;
              do {
                if (uVar2 - 1 == (int)lVar9) goto LAB_001820af;
                lVar1 = lVar9 + 1;
                lVar4 = lVar9 + 1;
                lVar9 = lVar1;
              } while (ph->_data[ph->_sizeY * lVar8 + lVar7][lVar4] == uVar10);
              bVar11 = (uint)lVar1 < uVar2;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"value at ",9);
            poVar5 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)lVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", sample ",9);
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", should be ",0xc);
            plVar6 = (long *)std::ostream::operator<<(poVar5,uVar10);
            std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
            std::ostream::put((char)plVar6);
            std::ostream::flush();
            std::ostream::flush();
            if (bVar11) {
              if (!bVar3) {
                return local_73;
              }
              break;
            }
          }
LAB_001820af:
          lVar9 = lVar7 + 1;
          bVar3 = rx <= lVar7;
          lVar7 = lVar9;
        } while (rx + 1 != (int)lVar9);
      }
      lVar7 = lVar8 + 1;
      local_73 = ry <= lVar8;
      lVar8 = lVar7;
    } while (ry + 1 != (int)lVar7);
  }
  return local_73;
}

Assistant:

bool
checkPixels (
    Array2D<unsigned int>& sampleCount,
    Array2D<T*>&           ph,
    int                    lx,
    int                    rx,
    int                    ly,
    int                    ry,
    int                    width)
{
    for (int y = ly; y <= ry; ++y)
    {
        for (int x = lx; x <= rx; ++x)
        {
            for (unsigned int i = 0; i < sampleCount[y][x]; i++)
            {
                if (ph[y][x][i] != static_cast<T> (((y * width + x) % 2049)))
                {
                    cout << "value at " << x << ", " << y << ", sample " << i
                         << ": " << ph[y][x][i] << ", should be "
                         << (y * width + x) % 2049 << endl
                         << flush;
                    return false;
                }
            }
        }
    }

    return true;
}